

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O2

bool __thiscall
glcts::ViewportArray::ScissorZeroDimension::checkResults
          (ScissorZeroDimension *this,texture *texture_0,texture *param_2,GLuint param_3)

{
  bool bVar1;
  GLuint layer;
  ulong uVar2;
  GLuint y;
  GLuint y_00;
  GLuint x;
  GLuint x_00;
  vector<int,_std::allocator<int>_> texture_data;
  
  texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&texture_data,0x40000);
  Utils::texture::get(texture_0,0x8d94,0x1404,
                      texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
  for (uVar2 = 0; uVar2 != 0x10; uVar2 = uVar2 + 1) {
    for (y_00 = 0; y_00 != 4; y_00 = y_00 + 1) {
      x_00 = 0;
      while (x_00 != 4) {
        bVar1 = DrawTestBase::checkRegionR32I
                          ((DrawTestBase *)this,x_00,y_00,-1,
                           texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + uVar2 * 0x4000);
        x_00 = x_00 + 1;
        if (!bVar1) goto LAB_00d8cd13;
      }
    }
  }
LAB_00d8cd13:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&texture_data.super__Vector_base<int,_std::allocator<int>_>);
  return 0xf < uVar2;
}

Assistant:

bool ScissorZeroDimension::checkResults(Utils::texture& texture_0, Utils::texture& /* texture_1 */,
										GLuint /* draw_call_index */)
{
	static const GLuint layer_size = m_width * m_height;

	bool check_result = true;

	std::vector<GLint> texture_data;
	texture_data.resize(layer_size * m_depth);
	texture_0.get(GL_RED_INTEGER, GL_INT, &texture_data[0]);

	/* 16 layers, all regions were not modified */
	for (GLuint layer = 0; layer < m_depth; ++layer)
	{
		for (GLuint y = 0; y < 4; ++y)
		{
			for (GLuint x = 0; x < 4; ++x)
			{
				GLint* layer_data = &texture_data[layer * layer_size];

				GLint expected_value = -1;

				bool result = checkRegionR32I(x, y, expected_value, layer_data);

				if (false == result)
				{
					check_result = false;
					goto end;
				}
			}
		}
	}

end:
	return check_result;
}